

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

Int128 * helper_atomic_cmpxchgo_be_mmu_tricore
                   (Int128 *__return_storage_ptr__,CPUArchState_conflict28 *env,
                   target_ulong_conflict addr,Int128 cmpv,Int128 newv,TCGMemOpIdx oi,
                   uintptr_t retaddr)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 cmp [16];
  undefined1 a_01 [16];
  undefined1 new [16];
  Int128 *pIVar1;
  Int128 *ptr;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  target_ulong_conflict addr_00;
  undefined4 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 uVar2;
  Int128 ret;
  Int128 *haddr;
  Int128 newv_local;
  Int128 cmpv_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict28 *env_local;
  
  addr_00 = (target_ulong_conflict)env;
  pIVar1 = (Int128 *)
           atomic_mmu_lookup((CPUArchState_conflict28 *)__return_storage_ptr__,addr_00,
                             (TCGMemOpIdx)cmpv,cmpv._8_8_);
  a._4_4_ = addr_00;
  a._0_4_ = in_stack_fffffffffffffec8;
  a._8_8_ = in_stack_fffffffffffffed0;
  ptr = bswap128((Int128 *)CONCAT44(in_register_00000014,addr),(Int128)a);
  a_00._4_4_ = addr_00;
  a_00._0_4_ = in_stack_fffffffffffffec8;
  a_00._8_8_ = extraout_RDX;
  uVar2 = extraout_RDX;
  bswap128((Int128 *)retaddr,(Int128)a_00);
  cmp._4_4_ = addr_00;
  cmp._0_4_ = in_stack_fffffffffffffec8;
  cmp._8_8_ = uVar2;
  new._8_8_ = ptr;
  new._0_8_ = pIVar1;
  pIVar1 = atomic16_cmpxchg(pIVar1,ptr,(Int128)cmp,(Int128)new);
  a_01._4_4_ = addr_00;
  a_01._0_4_ = in_stack_fffffffffffffec8;
  a_01._8_8_ = uVar2;
  pIVar1 = bswap128(pIVar1,(Int128)a_01);
  return pIVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}